

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pooling_2x2_pack4.h
# Opt level: O0

void ncnn::pooling2x2s2_max_pack4_sse(Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  float *pfVar1;
  long in_RSI;
  long in_RDI;
  undefined1 auVar2 [16];
  __m128 _max;
  __m128 _max1;
  __m128 _max0;
  __m128 _r11;
  __m128 _r10;
  __m128 _r01;
  __m128 _r00;
  int j;
  int i;
  float *r1;
  float *r0;
  float *outptr;
  Mat img0;
  int q;
  int tailstep;
  int outh;
  int outw;
  int inch;
  int w;
  undefined8 local_1f8;
  Mat *this;
  undefined1 local_1e8 [16];
  undefined8 uStack_1e0;
  undefined8 local_1d8;
  undefined8 uStack_1d0;
  int local_188;
  int local_184;
  undefined1 (*local_180) [16];
  undefined1 (*local_178) [16];
  Mat local_160;
  float *local_118;
  Mat local_110;
  int local_c8;
  int local_c4;
  int local_c0;
  int local_bc;
  int local_b8;
  int local_b4;
  undefined1 (*local_98) [16];
  undefined1 (*local_90) [16];
  undefined1 (*local_88) [16];
  undefined1 (*local_80) [16];
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  undefined8 uStack_20;
  undefined8 local_18;
  undefined8 uStack_10;
  float *local_8;
  
  local_b4 = *(int *)(in_RDI + 0x2c);
  local_b8 = *(int *)(in_RDI + 0x38);
  local_bc = *(int *)(in_RSI + 0x2c);
  local_c0 = *(int *)(in_RSI + 0x30);
  local_c4 = (local_b4 * 2 + local_bc * -2) * 4;
  for (local_c8 = 0; local_c8 < local_b8; local_c8 = local_c8 + 1) {
    Mat::channel(this,local_1f8._12_4_);
    Mat::channel(this,local_1f8._12_4_);
    pfVar1 = Mat::operator_cast_to_float_(&local_160);
    Mat::~Mat((Mat *)0x4b8034);
    local_118 = pfVar1;
    local_178 = (undefined1 (*) [16])Mat::row(&local_110,0);
    local_180 = (undefined1 (*) [16])Mat::row(&local_110,1);
    for (local_184 = 0; local_184 < local_c0; local_184 = local_184 + 1) {
      for (local_188 = 0; local_188 < local_bc; local_188 = local_188 + 1) {
        local_80 = local_178;
        local_28 = *(undefined8 *)*local_178;
        uStack_20 = *(undefined8 *)(*local_178 + 8);
        local_88 = local_178 + 1;
        local_38 = *(undefined8 *)*local_88;
        uStack_30 = *(undefined8 *)(local_178[1] + 8);
        local_90 = local_180;
        local_48 = *(undefined8 *)*local_180;
        uStack_40 = *(undefined8 *)(*local_180 + 8);
        local_98 = local_180 + 1;
        local_58 = *(undefined8 *)*local_98;
        uStack_50 = *(undefined8 *)(local_180[1] + 8);
        auVar2 = maxps(*local_178,*local_88);
        local_1e8 = maxps(*local_180,*local_98);
        local_1d8 = auVar2._0_8_;
        local_68 = local_1d8;
        uStack_1d0 = auVar2._8_8_;
        uStack_60 = uStack_1d0;
        uStack_70 = uStack_1e0;
        _local_1f8 = maxps(auVar2,local_1e8);
        local_8 = local_118;
        local_18 = local_1f8;
        *(undefined8 *)local_118 = local_1f8;
        *(undefined8 *)(local_118 + 2) = local_1f8._8_8_;
        local_178 = local_178 + 2;
        local_180 = local_180 + 2;
        local_118 = local_118 + 4;
        local_78 = this;
        uStack_10 = local_1f8._8_8_;
      }
      local_178 = (undefined1 (*) [16])(*local_178 + (long)local_c4 * 4);
      local_180 = (undefined1 (*) [16])(*local_180 + (long)local_c4 * 4);
    }
    Mat::~Mat((Mat *)0x4b830f);
  }
  return;
}

Assistant:

static void pooling2x2s2_max_pack4_sse(const Mat& bottom_blob, Mat& top_blob, const Option& opt)
{
    int w = bottom_blob.w;
    int inch = bottom_blob.c;

    int outw = top_blob.w;
    int outh = top_blob.h;

    const int tailstep = (w - 2 * outw + w) * 4;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < inch; q++)
    {
        const Mat img0 = bottom_blob.channel(q);
        float* outptr = top_blob.channel(q);

        const float* r0 = img0.row(0);
        const float* r1 = img0.row(1);

        for (int i = 0; i < outh; i++)
        {
            int j = 0;

            for (; j < outw; j++)
            {
                __m128 _r00 = _mm_loadu_ps(r0);
                __m128 _r01 = _mm_loadu_ps(r0 + 4);
                __m128 _r10 = _mm_loadu_ps(r1);
                __m128 _r11 = _mm_loadu_ps(r1 + 4);

                __m128 _max0 = _mm_max_ps(_r00, _r01);
                __m128 _max1 = _mm_max_ps(_r10, _r11);
                __m128 _max = _mm_max_ps(_max0, _max1);

                _mm_storeu_ps(outptr, _max);

                r0 += 8;
                r1 += 8;
                outptr += 4;
            }

            r0 += tailstep;
            r1 += tailstep;
        }
    }
}